

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack7(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (0x1f < bs + 0x1f) {
    uVar11 = bs + 0x1f >> 5;
    auVar2 = vpmovsxbd_avx(ZEXT416(0x3040b12));
    auVar3 = vpmovsxbd_avx(ZEXT416(0x787f7f7f));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x80f161d));
    auVar16._8_4_ = 0x7f;
    auVar16._0_8_ = 0x7f0000007f;
    auVar16._12_4_ = 0x7f;
    auVar5 = vpmovsxbd_avx(ZEXT416(0x50c131a));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x910171e));
    auVar7 = vpmovsxbd_avx(ZEXT416(0x60d141b));
    auVar8 = vpmovsxbd_avx(ZEXT416(0xa11181f));
    auVar9 = vpmovsxbd_avx(ZEXT416(0x70e151c));
    do {
      auVar14 = vpbroadcastd_avx512vl();
      *out = *in >> 0x19;
      auVar15 = vpsrlvd_avx2(auVar14,auVar2);
      auVar14 = vpsllvd_avx2(auVar14,auVar2);
      auVar14 = vpblendd_avx2(auVar15,auVar14,8);
      auVar14 = vpand_avx(auVar14,auVar3);
      *(undefined1 (*) [16])(out + 1) = auVar14;
      uVar1 = in[1];
      auVar15 = vpbroadcastd_avx512vl();
      auVar10 = vpsrlvd_avx2(auVar15,auVar4);
      auVar14 = vpshufd_avx(auVar14,0xff);
      auVar15 = vpor_avx(auVar10,auVar14);
      auVar14 = vpand_avx(auVar10,auVar16);
      auVar14 = vpblendd_avx2(auVar14,auVar15,1);
      *(undefined1 (*) [16])(out + 4) = auVar14;
      out[8] = uVar1 >> 1 & 0x7f;
      uVar12 = (uVar1 & 1) << 6;
      out[9] = uVar12;
      uVar1 = in[2];
      auVar14 = vpbroadcastd_avx512vl();
      auVar10 = vpsrlvd_avx2(auVar14,auVar5);
      auVar14 = vpinsrd_avx(auVar16,uVar12,0);
      auVar15 = vpor_avx(auVar10,auVar14);
      auVar14 = vpand_avx(auVar10,auVar16);
      auVar14 = vpblendd_avx2(auVar14,auVar15,1);
      *(undefined1 (*) [16])(out + 9) = auVar14;
      uVar12 = (uVar1 & 0x1f) << 2;
      out[0xd] = uVar12;
      uVar1 = in[3];
      auVar14 = vpbroadcastd_avx512vl();
      auVar10 = vpsrlvd_avx2(auVar14,auVar6);
      auVar14 = vpinsrd_avx(auVar16,uVar12,0);
      auVar15 = vpor_avx(auVar10,auVar14);
      auVar14 = vpand_avx(auVar10,auVar16);
      auVar14 = vpblendd_avx2(auVar14,auVar15,1);
      *(undefined1 (*) [16])(out + 0xd) = auVar14;
      out[0x11] = uVar1 >> 2 & 0x7f;
      uVar12 = (uVar1 & 3) << 5;
      out[0x12] = uVar12;
      uVar1 = in[4];
      auVar15 = vpbroadcastd_avx512vl();
      auVar14 = vpinsrd_avx(auVar16,uVar12,0);
      auVar10 = vpsrlvd_avx2(auVar15,auVar7);
      auVar15 = vpor_avx(auVar10,auVar14);
      auVar14 = vpand_avx(auVar10,auVar16);
      auVar14 = vpblendd_avx2(auVar14,auVar15,1);
      *(undefined1 (*) [16])(out + 0x12) = auVar14;
      uVar13 = uVar1 * 2 & 0x7e;
      out[0x16] = uVar13;
      uVar1 = in[5];
      auVar15 = vpbroadcastd_avx512vl();
      auVar14 = vpinsrd_avx(auVar16,uVar13,0);
      auVar10 = vpsrlvd_avx2(auVar15,auVar8);
      auVar15 = vpor_avx(auVar10,auVar14);
      auVar14 = vpand_avx(auVar10,auVar16);
      auVar14 = vpblendd_avx2(auVar14,auVar15,1);
      *(undefined1 (*) [16])(out + 0x16) = auVar14;
      out[0x1a] = uVar1 >> 3 & 0x7f;
      uVar12 = (uVar1 & 7) << 4;
      out[0x1b] = uVar12;
      uVar1 = in[6];
      auVar14 = vpbroadcastd_avx512vl();
      auVar10 = vpsrlvd_avx2(auVar14,auVar9);
      auVar14 = vpinsrd_avx(auVar16,uVar12,0);
      auVar15 = vpor_avx(auVar10,auVar14);
      auVar14 = vpand_avx(auVar10,auVar16);
      auVar14 = vpblendd_avx2(auVar14,auVar15,1);
      *(undefined1 (*) [16])(out + 0x1b) = auVar14;
      out[0x1f] = uVar1 & 0x7f;
      out = out + 0x20;
      in = in + 7;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack7(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 7, --bs) {
    out[0] = in[0] >> 25;
    out[1] = (in[0] >> 18) & 0x7f;
    out[2] = (in[0] >> 11) & 0x7f;
    out[3] = (in[0] >> 4) & 0x7f;
    out[4] = (in[0] << 3) & 0x7f;
    out[4] |= in[1] >> 29;
    out[5] = (in[1] >> 22) & 0x7f;
    out[6] = (in[1] >> 15) & 0x7f;
    out[7] = (in[1] >> 8) & 0x7f;
    out[8] = (in[1] >> 1) & 0x7f;
    out[9] = (in[1] << 6) & 0x7f;
    out[9] |= in[2] >> 26;
    out[10] = (in[2] >> 19) & 0x7f;
    out[11] = (in[2] >> 12) & 0x7f;
    out[12] = (in[2] >> 5) & 0x7f;
    out[13] = (in[2] << 2) & 0x7f;
    out[13] |= in[3] >> 30;
    out[14] = (in[3] >> 23) & 0x7f;
    out[15] = (in[3] >> 16) & 0x7f;
    out[16] = (in[3] >> 9) & 0x7f;
    out[17] = (in[3] >> 2) & 0x7f;
    out[18] = (in[3] << 5) & 0x7f;
    out[18] |= in[4] >> 27;
    out[19] = (in[4] >> 20) & 0x7f;
    out[20] = (in[4] >> 13) & 0x7f;
    out[21] = (in[4] >> 6) & 0x7f;
    out[22] = (in[4] << 1) & 0x7f;
    out[22] |= in[5] >> 31;
    out[23] = (in[5] >> 24) & 0x7f;
    out[24] = (in[5] >> 17) & 0x7f;
    out[25] = (in[5] >> 10) & 0x7f;
    out[26] = (in[5] >> 3) & 0x7f;
    out[27] = (in[5] << 4) & 0x7f;
    out[27] |= in[6] >> 28;
    out[28] = (in[6] >> 21) & 0x7f;
    out[29] = (in[6] >> 14) & 0x7f;
    out[30] = (in[6] >> 7) & 0x7f;
    out[31] = in[6] & 0x7f;
  }
}